

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_NtkPrintPaths(Acb_Ntk_t *p)

{
  Acb_ObjType_t AVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint i;
  
  for (i = 1; (int)i < (p->vObjType).nSize; i = i + 1) {
    AVar1 = Acb_ObjType(p,i);
    if (AVar1 != ABC_OPER_NONE) {
      printf("Obj = %5d :   ",(ulong)i);
      uVar2 = Acb_ObjLevelD(p,i);
      printf("LevelD = %5d  ",(ulong)uVar2);
      uVar2 = Acb_ObjLevelR(p,i);
      printf("LevelR = %5d    ",(ulong)uVar2);
      uVar2 = Acb_ObjPathD(p,i);
      printf("PathD = %5d  ",(ulong)uVar2);
      uVar2 = Acb_ObjPathR(p,i);
      printf("PathR = %5d    ",(ulong)uVar2);
      iVar3 = Acb_ObjPathD(p,i);
      iVar4 = Acb_ObjPathR(p,i);
      printf("Paths = %5d  ",(ulong)(uint)(iVar3 * iVar4));
      putchar(10);
    }
  }
  return;
}

Assistant:

void Acb_NtkPrintPaths( Acb_Ntk_t * p )
{
    int iObj;
    Acb_NtkForEachObj( p, iObj )
    {
        printf( "Obj = %5d :   ",   iObj );
        printf( "LevelD = %5d  ",   Acb_ObjLevelD(p, iObj) );
        printf( "LevelR = %5d    ", Acb_ObjLevelR(p, iObj) );
        printf( "PathD = %5d  ",    Acb_ObjPathD(p, iObj) );
        printf( "PathR = %5d    ",  Acb_ObjPathR(p, iObj) );
        printf( "Paths = %5d  ",    Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj) );
        printf( "\n" );
    }
}